

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LoadConstantLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_loadconstant(NeuralNetworkLayer *this)

{
  bool bVar1;
  LoadConstantLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_loadconstant(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_loadconstant(this);
    this_00 = (LoadConstantLayerParams *)operator_new(0x38);
    LoadConstantLayerParams::LoadConstantLayerParams(this_00);
    (this->layer_).loadconstant_ = this_00;
  }
  return (LoadConstantLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoadConstantLayerParams* NeuralNetworkLayer::mutable_loadconstant() {
  if (!has_loadconstant()) {
    clear_layer();
    set_has_loadconstant();
    layer_.loadconstant_ = new ::CoreML::Specification::LoadConstantLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.loadConstant)
  return layer_.loadconstant_;
}